

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::StrEqualityMatcher<std::__cxx11::string>::MatchAndExplain<char_const>
          (StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,char *s,MatchResultListener *listener)

{
  char *in_RSI;
  MatchResultListener *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  allocator local_41;
  string local_40 [63];
  byte local_1;
  
  if (in_RSI == (char *)0x0) {
    local_1 = (*(byte *)&in_RDI[2]._vptr_MatchResultListener ^ 0xff) & 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,in_RSI,&local_41);
    local_1 = MatchAndExplain<std::__cxx11::string>
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MatchAndExplain(CharType* s, MatchResultListener* listener) const {
    if (s == NULL) {
      return !expect_eq_;
    }
    return MatchAndExplain(StringType(s), listener);
  }